

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64_unit.cpp
# Opt level: O0

void anon_unknown.dwarf_41e4::test_iterator_move_equalorlarger(void **param_1)

{
  roaring64_bitmap_t *r_00;
  roaring64_iterator_t *it_00;
  roaring64_iterator_t *in_RDI;
  roaring64_iterator_t *it;
  roaring64_bitmap_t *r;
  roaring64_bitmap_t *in_stack_00000080;
  
  r_00 = roaring64_bitmap_create();
  it_00 = roaring64_iterator_create(r_00);
  roaring64_iterator_move_equalorlarger((roaring64_iterator_t *)r,(uint64_t)it);
  _assert_true((unsigned_long)it,(char *)in_RDI,(char *)r_00,(int)((ulong)it_00 >> 0x20));
  roaring64_iterator_move_equalorlarger((roaring64_iterator_t *)r,(uint64_t)it);
  _assert_true((unsigned_long)it,(char *)in_RDI,(char *)r_00,(int)((ulong)it_00 >> 0x20));
  roaring64_bitmap_add((roaring64_bitmap_t *)it,(uint64_t)in_RDI);
  roaring64_bitmap_add((roaring64_bitmap_t *)it,(uint64_t)in_RDI);
  roaring64_bitmap_add((roaring64_bitmap_t *)it,(uint64_t)in_RDI);
  roaring64_bitmap_add((roaring64_bitmap_t *)it,(uint64_t)in_RDI);
  roaring64_bitmap_add((roaring64_bitmap_t *)it,(uint64_t)in_RDI);
  roaring64_iterator_reinit(r_00,it_00);
  roaring64_iterator_move_equalorlarger((roaring64_iterator_t *)r,(uint64_t)it);
  _assert_true((unsigned_long)it,(char *)in_RDI,(char *)r_00,(int)((ulong)it_00 >> 0x20));
  roaring64_iterator_has_value(it_00);
  _assert_true((unsigned_long)it,(char *)in_RDI,(char *)r_00,(int)((ulong)it_00 >> 0x20));
  roaring64_iterator_value(it_00);
  _assert_int_equal((unsigned_long)it,(unsigned_long)in_RDI,(char *)r_00,(int)((ulong)it_00 >> 0x20)
                   );
  roaring64_iterator_move_equalorlarger((roaring64_iterator_t *)r,(uint64_t)it);
  _assert_true((unsigned_long)it,(char *)in_RDI,(char *)r_00,(int)((ulong)it_00 >> 0x20));
  roaring64_iterator_has_value(it_00);
  _assert_true((unsigned_long)it,(char *)in_RDI,(char *)r_00,(int)((ulong)it_00 >> 0x20));
  roaring64_iterator_value(it_00);
  _assert_int_equal((unsigned_long)it,(unsigned_long)in_RDI,(char *)r_00,(int)((ulong)it_00 >> 0x20)
                   );
  roaring64_iterator_move_equalorlarger((roaring64_iterator_t *)r,(uint64_t)it);
  _assert_true((unsigned_long)it,(char *)in_RDI,(char *)r_00,(int)((ulong)it_00 >> 0x20));
  roaring64_iterator_has_value(it_00);
  _assert_true((unsigned_long)it,(char *)in_RDI,(char *)r_00,(int)((ulong)it_00 >> 0x20));
  roaring64_iterator_value(it_00);
  _assert_int_equal((unsigned_long)it,(unsigned_long)in_RDI,(char *)r_00,(int)((ulong)it_00 >> 0x20)
                   );
  roaring64_iterator_reinit(r_00,it_00);
  roaring64_iterator_move_equalorlarger((roaring64_iterator_t *)r,(uint64_t)it);
  _assert_true((unsigned_long)it,(char *)in_RDI,(char *)r_00,(int)((ulong)it_00 >> 0x20));
  roaring64_iterator_has_value(it_00);
  _assert_true((unsigned_long)it,(char *)in_RDI,(char *)r_00,(int)((ulong)it_00 >> 0x20));
  roaring64_iterator_value(it_00);
  _assert_int_equal((unsigned_long)it,(unsigned_long)in_RDI,(char *)r_00,(int)((ulong)it_00 >> 0x20)
                   );
  roaring64_iterator_move_equalorlarger((roaring64_iterator_t *)r,(uint64_t)it);
  _assert_true((unsigned_long)it,(char *)in_RDI,(char *)r_00,(int)((ulong)it_00 >> 0x20));
  roaring64_iterator_has_value(it_00);
  _assert_true((unsigned_long)it,(char *)in_RDI,(char *)r_00,(int)((ulong)it_00 >> 0x20));
  roaring64_iterator_value(it_00);
  _assert_int_equal((unsigned_long)it,(unsigned_long)in_RDI,(char *)r_00,(int)((ulong)it_00 >> 0x20)
                   );
  roaring64_iterator_move_equalorlarger((roaring64_iterator_t *)r,(uint64_t)it);
  _assert_true((unsigned_long)it,(char *)in_RDI,(char *)r_00,(int)((ulong)it_00 >> 0x20));
  roaring64_iterator_has_value(it_00);
  _assert_true((unsigned_long)it,(char *)in_RDI,(char *)r_00,(int)((ulong)it_00 >> 0x20));
  roaring64_iterator_previous(in_RDI);
  _assert_true((unsigned_long)it,(char *)in_RDI,(char *)r_00,(int)((ulong)it_00 >> 0x20));
  roaring64_iterator_value(it_00);
  _assert_int_equal((unsigned_long)it,(unsigned_long)in_RDI,(char *)r_00,(int)((ulong)it_00 >> 0x20)
                   );
  roaring64_iterator_advance(in_RDI);
  _assert_true((unsigned_long)it,(char *)in_RDI,(char *)r_00,(int)((ulong)it_00 >> 0x20));
  roaring64_iterator_move_equalorlarger((roaring64_iterator_t *)r,(uint64_t)it);
  _assert_true((unsigned_long)it,(char *)in_RDI,(char *)r_00,(int)((ulong)it_00 >> 0x20));
  roaring64_iterator_has_value(it_00);
  _assert_true((unsigned_long)it,(char *)in_RDI,(char *)r_00,(int)((ulong)it_00 >> 0x20));
  roaring64_iterator_value(it_00);
  _assert_int_equal((unsigned_long)it,(unsigned_long)in_RDI,(char *)r_00,(int)((ulong)it_00 >> 0x20)
                   );
  roaring64_iterator_move_equalorlarger((roaring64_iterator_t *)r,(uint64_t)it);
  _assert_true((unsigned_long)it,(char *)in_RDI,(char *)r_00,(int)((ulong)it_00 >> 0x20));
  roaring64_iterator_has_value(it_00);
  _assert_true((unsigned_long)it,(char *)in_RDI,(char *)r_00,(int)((ulong)it_00 >> 0x20));
  roaring64_iterator_value(it_00);
  _assert_int_equal((unsigned_long)it,(unsigned_long)in_RDI,(char *)r_00,(int)((ulong)it_00 >> 0x20)
                   );
  roaring64_iterator_previous(in_RDI);
  _assert_true((unsigned_long)it,(char *)in_RDI,(char *)r_00,(int)((ulong)it_00 >> 0x20));
  roaring64_iterator_previous(in_RDI);
  _assert_true((unsigned_long)it,(char *)in_RDI,(char *)r_00,(int)((ulong)it_00 >> 0x20));
  roaring64_iterator_move_equalorlarger((roaring64_iterator_t *)r,(uint64_t)it);
  _assert_true((unsigned_long)it,(char *)in_RDI,(char *)r_00,(int)((ulong)it_00 >> 0x20));
  roaring64_iterator_has_value(it_00);
  _assert_true((unsigned_long)it,(char *)in_RDI,(char *)r_00,(int)((ulong)it_00 >> 0x20));
  roaring64_iterator_value(it_00);
  _assert_int_equal((unsigned_long)it,(unsigned_long)in_RDI,(char *)r_00,(int)((ulong)it_00 >> 0x20)
                   );
  roaring64_iterator_free((roaring64_iterator_t *)0x10965b);
  roaring64_bitmap_free(in_stack_00000080);
  return;
}

Assistant:

DEFINE_TEST(test_iterator_move_equalorlarger) {
    roaring64_bitmap_t* r = roaring64_bitmap_create();

    roaring64_iterator_t* it = roaring64_iterator_create(r);
    assert_false(roaring64_iterator_move_equalorlarger(it, 0));
    assert_false(roaring64_iterator_move_equalorlarger(it, UINT64_MAX));

    roaring64_bitmap_add(r, 0);
    roaring64_bitmap_add(r, 1ULL << 35);
    roaring64_bitmap_add(r, (1ULL << 35) + 1);
    roaring64_bitmap_add(r, (1ULL << 35) + 2);
    roaring64_bitmap_add(r, (1ULL << 36));

    roaring64_iterator_reinit(r, it);
    assert_true(roaring64_iterator_move_equalorlarger(it, 0));
    assert_true(roaring64_iterator_has_value(it));
    assert_int_equal(roaring64_iterator_value(it), 0);

    assert_true(roaring64_iterator_move_equalorlarger(it, 0));
    assert_true(roaring64_iterator_has_value(it));
    assert_int_equal(roaring64_iterator_value(it), 0);

    assert_true(roaring64_iterator_move_equalorlarger(it, 1));
    assert_true(roaring64_iterator_has_value(it));
    assert_int_equal(roaring64_iterator_value(it), (1ULL << 35));

    roaring64_iterator_reinit(r, it);

    assert_true(roaring64_iterator_move_equalorlarger(it, (1ULL << 35) + 2));
    assert_true(roaring64_iterator_has_value(it));
    assert_int_equal(roaring64_iterator_value(it), ((1ULL << 35) + 2));

    assert_true(roaring64_iterator_move_equalorlarger(it, (1ULL << 35) + 3));
    assert_true(roaring64_iterator_has_value(it));
    assert_int_equal(roaring64_iterator_value(it), (1ULL << 36));

    assert_false(roaring64_iterator_move_equalorlarger(it, (1ULL << 36) + 1));
    assert_false(roaring64_iterator_has_value(it));

    // Check that we can move backward from after the last entry.
    assert_true(roaring64_iterator_previous(it));
    assert_int_equal(roaring64_iterator_value(it), (1ULL << 36));

    // Check that we can move even after the last entry.
    assert_false(roaring64_iterator_advance(it));
    assert_true(roaring64_iterator_move_equalorlarger(it, (1ULL << 36)));
    assert_true(roaring64_iterator_has_value(it));
    assert_int_equal(roaring64_iterator_value(it), (1ULL << 36));

    // Check that we can move backward using move_equalorlarger.
    assert_true(roaring64_iterator_move_equalorlarger(it, (1ULL << 35) - 1));
    assert_true(roaring64_iterator_has_value(it));
    assert_int_equal(roaring64_iterator_value(it), (1ULL << 35));

    // Check that we can move even before the first entry.
    assert_true(roaring64_iterator_previous(it));
    assert_false(roaring64_iterator_previous(it));
    assert_true(roaring64_iterator_move_equalorlarger(it, 0));
    assert_true(roaring64_iterator_has_value(it));
    assert_int_equal(roaring64_iterator_value(it), 0);

    roaring64_iterator_free(it);
    roaring64_bitmap_free(r);
}